

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

ON_OBSOLETE_V5_HatchExtra * ON_OBSOLETE_V5_HatchExtra::HatchExtension(ON_Hatch *pHatch)

{
  bool bVar1;
  ON_OBSOLETE_V5_HatchExtra *pOVar2;
  ON_OBSOLETE_V5_HatchExtra *pOVar3;
  ON_UUID local_28;
  
  if (pHatch != (ON_Hatch *)0x0) {
    local_28 = ON_ClassId::Uuid(&m_ON_OBSOLETE_V5_HatchExtra_class_rtti);
    pOVar2 = (ON_OBSOLETE_V5_HatchExtra *)ON_Object::GetUserData((ON_Object *)pHatch,&local_28);
    if (pOVar2 == (ON_OBSOLETE_V5_HatchExtra *)0x0) {
      pOVar3 = (ON_OBSOLETE_V5_HatchExtra *)0x0;
    }
    else {
      bVar1 = ON_Object::IsKindOf((ON_Object *)pOVar2,&m_ON_OBSOLETE_V5_HatchExtra_class_rtti);
      pOVar3 = (ON_OBSOLETE_V5_HatchExtra *)0x0;
      if (bVar1) {
        pOVar3 = pOVar2;
      }
    }
    if (pOVar3 != (ON_OBSOLETE_V5_HatchExtra *)0x0) {
      return pOVar3;
    }
    pOVar2 = (ON_OBSOLETE_V5_HatchExtra *)operator_new(0xd8);
    ON_OBSOLETE_V5_HatchExtra(pOVar2);
    bVar1 = ON_Object::AttachUserData((ON_Object *)pHatch,(ON_UserData *)pOVar2);
    if (bVar1) {
      return pOVar2;
    }
    (*(pOVar2->super_ON_UserData).super_ON_Object._vptr_ON_Object[4])(pOVar2);
  }
  return (ON_OBSOLETE_V5_HatchExtra *)0x0;
}

Assistant:

ON_OBSOLETE_V5_HatchExtra* ON_OBSOLETE_V5_HatchExtra::HatchExtension(const ON_Hatch* pHatch)
{
  ON_OBSOLETE_V5_HatchExtra* pExtra = nullptr;
  if(pHatch)
  {
    pExtra = ON_OBSOLETE_V5_HatchExtra::Cast(pHatch->GetUserData(ON_CLASS_ID(ON_OBSOLETE_V5_HatchExtra)));
    if(pExtra == nullptr)
    {
      pExtra = new ON_OBSOLETE_V5_HatchExtra;
      if(pExtra)
      {
        if(!const_cast<ON_Hatch*>(pHatch)->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = nullptr;
        }
      }  
    }
  }
  return pExtra;
}